

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::searchdashwordlist(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  uint uVar1;
  uint nameLength;
  uint nameToFind;
  Xt x;
  Definition *pDVar2;
  
  requireDStackDepth(this,3,"SEARCH-WORDLIST");
  this_00 = &this->dStack;
  uVar1 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  nameLength = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  nameToFind = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  x = findDefinitionByWid(this,nameToFind,nameLength,uVar1);
  if (x == 0) {
    uVar1 = 0;
  }
  else {
    ForthStack<unsigned_int>::push(this_00,x);
    pDVar2 = definitionsAt(this,x);
    uVar1 = -(uint)((pDVar2->FlagImmediate & pDVar2->flags) == 0) | 1;
  }
  ForthStack<unsigned_int>::push(this_00,uVar1);
  return;
}

Assistant:

void searchdashwordlist() {
			REQUIRE_DSTACK_DEPTH(3, "SEARCH-WORDLIST");
			auto wid = CELL(dStack.getTop()); pop();
			auto length = CELL(dStack.getTop()); pop();
			auto caddr = CADDR(dStack.getTop()); pop();
			//auto length = static_cast<Cell>(getDataChar(caddr));
			auto name = caddr;
			auto word = findDefinitionByWid(name, length,wid);
			if (word == 0) {
				push(0);
			}
			else {
				dStack.push(CELL(word));
				push(definitionsAt(word).isImmediate() ? 1 : Cell(-1));
			}
		}